

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3537c6::PointerType::printRight(PointerType *this,OutputStream *s)

{
  bool bVar1;
  int iVar2;
  Node *pNVar3;
  
  pNVar3 = this->Pointee;
  if (pNVar3->K == KObjCProtoName) {
    bVar1 = ObjCProtoName::isObjCObject((ObjCProtoName *)pNVar3[1]._vptr_Node);
    if (bVar1) {
      return;
    }
  }
  if (pNVar3->ArrayCache != Yes) {
    if (pNVar3->ArrayCache == Unknown) {
      iVar2 = (*pNVar3->_vptr_Node[1])(pNVar3,s);
      if ((char)iVar2 != '\0') goto LAB_00193cc9;
      pNVar3 = this->Pointee;
    }
    if (pNVar3->FunctionCache != Yes) {
      if (pNVar3->FunctionCache != Unknown) goto LAB_00193ce5;
      iVar2 = (*pNVar3->_vptr_Node[2])(pNVar3,s);
      if ((char)iVar2 == '\0') goto LAB_00193ce5;
    }
  }
LAB_00193cc9:
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = ')';
  s->CurrentPosition = s->CurrentPosition + 1;
LAB_00193ce5:
  (*this->Pointee->_vptr_Node[5])(this->Pointee,s);
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (Pointee->getKind() != KObjCProtoName ||
        !static_cast<const ObjCProtoName *>(Pointee)->isObjCObject()) {
      if (Pointee->hasArray(s) || Pointee->hasFunction(s))
        s += ")";
      Pointee->printRight(s);
    }
  }